

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_FillSubClampColumn(void)

{
  int iVar1;
  DWORD *pDVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  DWORD b;
  DWORD a;
  int pitch;
  DWORD fg;
  DWORD *bg2rgb;
  BYTE *dest;
  int count;
  
  pDVar2 = dc_destblend;
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    bg2rgb = (DWORD *)dc_dest;
    uVar3 = dc_srccolor | 0x40100400;
    do {
      uVar4 = uVar3 - pDVar2[(byte)*bg2rgb];
      uVar5 = uVar4 & 0x40100400;
      uVar4 = uVar5 - (uVar5 >> 5) & uVar4 | 0x1f07c1f;
      *(BYTE *)bg2rgb = RGB32k.All[uVar4 & uVar4 >> 0xf];
      bg2rgb = (DWORD *)((long)bg2rgb + (long)iVar1);
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_FillSubClampColumn (void)
{
	int count;
	BYTE *dest;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;
	DWORD *bg2rgb;
	DWORD fg;

	bg2rgb = dc_destblend;
	fg = dc_srccolor | 0x40100400;
	int pitch = dc_pitch;

	do
	{
		DWORD a = fg - bg2rgb[*dest];
		DWORD b = a;

		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		*dest = RGB32k.All[a & (a>>15)];
		dest += pitch; 
	} while (--count);

}